

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O1

int Cba_ObjAttrValue(Cba_Ntk_t *p,int i,int x)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  
  if (i < 0) {
    __assert_fail("i>=0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cba.h"
                  ,0xf3,"int Cba_ObjAttrSize(Cba_Ntk_t *, int)");
  }
  iVar5 = 0;
  if (0 < (p->vObjAttr).nSize) {
    iVar1 = Vec_IntGetEntry(&p->vObjAttr,i);
    iVar5 = 0;
    if (iVar1 != 0) {
      if ((p->vObjAttr).nSize < 1) {
        uVar2 = 0;
      }
      else {
        uVar2 = Vec_IntGetEntry(&p->vObjAttr,i);
      }
      if (((int)uVar2 < 0) || ((p->vAttrSto).nSize <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = (p->vAttrSto).pArray[uVar2];
    }
  }
  if (0 < (p->vObjAttr).nSize) {
    iVar1 = Vec_IntGetEntry(&p->vObjAttr,i);
    if (iVar1 != 0) {
      if ((p->vObjAttr).nSize < 1) {
        uVar2 = 1;
      }
      else {
        iVar1 = Vec_IntGetEntry(&p->vObjAttr,i);
        uVar2 = iVar1 + 1;
      }
      if (((int)uVar2 < 0) || ((p->vAttrSto).nSize <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar3 = (p->vAttrSto).pArray + uVar2;
      goto LAB_003ef500;
    }
  }
  piVar3 = (int *)0x0;
LAB_003ef500:
  if (0 < iVar5) {
    uVar4 = 0;
    do {
      if (piVar3[uVar4] == x) {
        return *(int *)((long)piVar3 + ((uVar4 & 0xffffffff) << 2 | 4));
      }
      uVar4 = uVar4 + 2;
    } while ((int)uVar4 < iVar5);
  }
  return 0;
}

Assistant:

static inline int            Cba_ObjAttr( Cba_Ntk_t * p, int i )             { assert(i>=0); return Cba_NtkHasObjAttrs(p) ? Vec_IntGetEntry(&p->vObjAttr, i) : 0;          }